

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::RenderTestCase::iterate(RenderTestCase *this)

{
  RenderTarget *pRVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  NotSupportedError *this_01;
  string local_270;
  string local_250;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  MessageBuilder local_198;
  int local_18;
  int local_14;
  int height;
  int width;
  RenderTestCase *this_local;
  
  _height = this;
  pRVar1 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  local_14 = tcu::RenderTarget::getWidth(pRVar1);
  pRVar1 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  local_18 = tcu::RenderTarget::getHeight(pRVar1);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [21])"Render target size: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_14);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2a9098a);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_18);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  if ((199 < local_14) && (199 < local_18)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"Render target size must be at least ",&local_229);
  de::toString<int>(&local_250,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+(&local_208,&local_228,&local_250);
  std::operator+(&local_1e8,&local_208,"x");
  de::toString<int>(&local_270,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+(&local_1c8,&local_1e8,&local_270);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_1c8);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

RenderTestCase::IterateResult RenderTestCase::iterate (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	m_testCtx.getLog() << TestLog::Message << "Render target size: " << width << "x" << height << TestLog::EndMessage;
	if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // success by default
	testRender();

	return STOP;
}